

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

void __thiscall Game::Run(Game *this,Renderer *renderer,size_t target_frame_duration)

{
  Snake *pSVar1;
  Snake *pSVar2;
  int iVar3;
  int fps;
  bool running;
  thread player2Input;
  thread player1Input;
  undefined1 local_155 [13];
  reference_wrapper<bool> local_148;
  int local_13c;
  size_t local_138;
  Renderer *local_130;
  reference_wrapper<Snake> local_128;
  code *local_120;
  undefined8 local_118;
  thread local_110;
  SDL_Point *local_108;
  bool *local_100;
  vector<SDL_Point,_std::allocator<SDL_Point>_> *local_f8;
  bool *local_f0;
  vector<SDL_Point,_std::allocator<SDL_Point>_> *local_e8;
  reference_wrapper<Snake> local_e0;
  Snake local_d8;
  Snake local_98;
  Controller local_58;
  Controller local_48;
  
  local_138 = target_frame_duration;
  local_130 = renderer;
  local_155._1_4_ = SDL_GetTicks();
  local_155[0] = '\x01';
  local_48._Up = 0x40000052;
  local_48._Down = 0x40000051;
  local_48._Right = 0x4000004f;
  local_48._Left = 0x40000050;
  local_58._Up = 0x77;
  local_58._Down = 0x73;
  local_58._Right = 100;
  local_58._Left = 0x61;
  pSVar1 = &this->snake2;
  local_e8 = &(this->snake).body;
  local_f0 = &(this->snake).growing;
  local_f8 = &(this->snake2).body;
  local_100 = &(this->snake2).growing;
  local_108 = &this->food;
  fps = 0;
  local_155._5_8_ = this;
  while( true ) {
    local_13c = SDL_GetTicks();
    local_120 = Controller::HandleInput;
    local_118 = 0;
    local_128._M_data = (Snake *)local_155._5_8_;
    local_148._M_data = (bool *)local_155;
    std::thread::
    thread<void(Controller::*)(bool&,Snake&)const,Controller&,std::reference_wrapper<bool>,std::reference_wrapper<Snake>,void>
              (&local_110,(offset_in_Controller_to_subr *)&local_120,&local_48,&local_148,&local_128
              );
    local_120 = Controller::HandleInput;
    local_118 = 0;
    local_128._M_data = (Snake *)local_155;
    local_e0._M_data = pSVar1;
    std::thread::
    thread<void(Controller::*)(bool&,Snake&)const,Controller&,std::reference_wrapper<bool>,std::reference_wrapper<Snake>,void>
              ((thread *)&local_148,(offset_in_Controller_to_subr *)&local_120,&local_58,
               (reference_wrapper<bool> *)&local_128,&local_e0);
    std::thread::join();
    std::thread::join();
    Update((Game *)local_155._5_8_);
    local_d8.head_x = ((Snake *)local_155._5_8_)->head_x;
    local_d8.head_y = ((Snake *)local_155._5_8_)->head_y;
    local_d8.direction = ((Snake *)local_155._5_8_)->direction;
    local_d8.speed = ((Snake *)local_155._5_8_)->speed;
    pSVar2 = (Snake *)local_155._5_8_;
    local_d8.size = pSVar2->size;
    local_d8.alive = pSVar2->alive;
    local_d8._13_3_ = *(undefined3 *)&pSVar2->field_0xd;
    std::vector<SDL_Point,_std::allocator<SDL_Point>_>::vector(&local_d8.body,local_e8);
    local_d8.grid_height = *(int *)(local_f0 + 8);
    local_d8._48_8_ = *(undefined8 *)local_f0;
    local_98.head_x = (this->snake2).head_x;
    local_98.head_y = (this->snake2).head_y;
    local_98.direction = pSVar1->direction;
    local_98.speed = pSVar1->speed;
    local_98.size = (this->snake2).size;
    local_98.alive = (this->snake2).alive;
    local_98._13_3_ = *(undefined3 *)&(this->snake2).field_0xd;
    std::vector<SDL_Point,_std::allocator<SDL_Point>_>::vector(&local_98.body,local_f8);
    local_98.grid_height = *(int *)(local_100 + 8);
    local_98._48_8_ = *(undefined8 *)local_100;
    Renderer::Render(local_130,&local_d8,&local_98,local_108);
    if (local_98.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_d8.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    iVar3 = SDL_GetTicks();
    fps = fps + 1;
    if (999 < (uint)(iVar3 - local_155._1_4_)) {
      Renderer::UpdateWindowTitle(local_130,*(int *)(local_155._5_8_ + 0x27a8),fps);
      fps = 0;
      local_155._1_4_ = iVar3;
    }
    if ((uint)(iVar3 - local_13c) < local_138) {
      SDL_Delay((int)local_138 - (iVar3 - local_13c));
    }
    if ((local_148._M_data != (bool *)0x0) || (local_110._M_id._M_thread != 0)) break;
    if (local_155[0] == '\0') {
      return;
    }
  }
  std::terminate();
}

Assistant:

void Game::Run(Renderer &renderer, std::size_t target_frame_duration) { 
	Uint32 title_timestamp = SDL_GetTicks();
    Uint32 frame_start;
    Uint32 frame_end;
    Uint32 frame_duration;
    int frame_count = 0;
    bool running = true;
  	
  	Controller player_1_controller(SDLK_UP, SDLK_DOWN, SDLK_RIGHT, SDLK_LEFT);
  	Controller player_2_controller(SDLK_w, SDLK_s, SDLK_d, SDLK_a);
  	
    while (running) {
      frame_start = SDL_GetTicks();

    // Input, Update, Render - the main game loop.
    std::thread player1Input(&Controller::HandleInput, player_1_controller, std::ref(running), std::ref(snake));
    std::thread player2Input(&Controller::HandleInput, player_2_controller, std::ref(running), std::ref(snake2));
    player1Input.join();
    player2Input.join();
    
    Update();
    renderer.Render(snake, snake2, food);


      frame_end = SDL_GetTicks();

      // Keep track of how long each loop through the input/update/render cycle
      // takes.
      frame_count++;
      frame_duration = frame_end - frame_start;

      // After every second, update the window title.
      if (frame_end - title_timestamp >= 1000) {
        renderer.UpdateWindowTitle(score, frame_count);
        frame_count = 0;
        title_timestamp = frame_end;
      }

      // If the time for this frame is too small (i.e. frame_duration is
      // smaller than the target ms_per_frame), delay the loop to
      // achieve the correct frame rate.
      if (frame_duration < target_frame_duration) {
        SDL_Delay(target_frame_duration - frame_duration);
      }
  	}  
}